

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::ColladaWriter::writeGeometry(ofstream *out,Scene *scene)

{
  char cVar1;
  Mesh *mesh;
  _Base_ptr p_Var2;
  int id;
  _Rb_tree_header *p_Var3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   <library_geometries>",0x17);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  p_Var2 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    id = 0;
    do {
      if (*(long *)(p_Var2 + 1) != 0) {
        mesh = (Mesh *)__dynamic_cast(*(long *)(p_Var2 + 1),&DynamicScene::SceneObject::typeinfo,
                                      &DynamicScene::Mesh::typeinfo,0);
        if (mesh != (Mesh *)0x0) {
          id = id + 1;
          writeMesh(out,mesh,id);
        }
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   </library_geometries>",0x18)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ColladaWriter::writeGeometry( ofstream& out, DynamicScene::Scene& scene )
{
   int nMeshes = 0;

   out << "   <library_geometries>" << endl;
   for( auto o : scene.objects )
   {
      DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>( o );
      if( mesh )
      {
         nMeshes++;
         writeMesh( out, mesh, nMeshes );
      }

   }
   out << "   </library_geometries>" << endl;
}